

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::Transformations::add(Transformations *this,Transformations *other)

{
  long lVar1;
  undefined8 uVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  void *pvVar5;
  void *ptr;
  long in_RSI;
  long in_RDI;
  size_t i;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> v;
  size_t i_4;
  size_t i_3;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items;
  size_t i_2;
  size_t i_1;
  size_t new_size_alloced;
  void *pvVar6;
  ulong size;
  ulong local_330;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 *local_2c0;
  void *local_2b8;
  ulong local_2b0;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  ulong local_260;
  ulong local_258;
  long local_250;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  void *local_228;
  undefined8 *local_220;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined8 *local_208;
  unsigned_long local_200 [2];
  ulong local_1f0;
  ulong local_1e8;
  void *local_1e0;
  ulong local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  undefined8 *local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  void *local_30;
  undefined8 local_28;
  long local_20;
  void *local_18;
  ulong local_10;
  long local_8;
  
  for (local_330 = 0; local_330 < *(ulong *)(in_RSI + 0x10); local_330 = local_330 + 1) {
    ptr = (void *)(in_RDI + 8);
    local_2b0 = local_330;
    local_8 = in_RSI + 8;
    local_10 = local_330;
    local_2c0 = (undefined8 *)(*(long *)(in_RSI + 0x20) + local_330 * 0x40);
    local_278 = &local_308;
    local_198 = &local_2f8;
    local_1a0 = &local_2e8;
    local_168 = &local_2d8;
    local_308 = *local_2c0;
    uStack_300 = local_2c0[1];
    local_f8 = local_2c0 + 2;
    local_f0 = &local_2f8;
    local_2f8 = *local_f8;
    uStack_2f0 = local_2c0[3];
    local_108 = local_2c0 + 4;
    local_100 = &local_2e8;
    local_2e8 = *local_108;
    uStack_2e0 = local_2c0[5];
    local_270 = local_2c0 + 6;
    local_268 = &local_2d8;
    local_2d8 = *local_270;
    uStack_2d0 = local_2c0[7];
    size = *(ulong *)(in_RDI + 0x10);
    local_1e8 = *(long *)(in_RDI + 0x10) + 1;
    local_2b8 = ptr;
    local_280 = local_2c0;
    local_1e0 = ptr;
    local_1c8 = local_278;
    local_190 = local_278;
    local_118 = local_2c0;
    local_110 = local_278;
    local_e8 = local_2c0;
    local_e0 = local_278;
    if (*(ulong *)(in_RDI + 0x18) < local_1e8) {
      uVar3 = local_1e8;
      if (*(long *)(in_RDI + 0x18) != 0) {
        local_1f0 = *(ulong *)(in_RDI + 0x18);
        while (local_1f0 < local_1e8) {
          local_200[1] = 1;
          local_200[0] = local_1f0 << 1;
          puVar4 = std::max<unsigned_long>(local_200 + 1,local_200);
          local_1f0 = *puVar4;
        }
        local_1d8 = local_1f0;
        uVar3 = local_1d8;
      }
    }
    else {
      uVar3 = *(ulong *)(in_RDI + 0x18);
    }
    local_1d8 = uVar3;
    local_238 = local_1d8;
    uVar3 = size;
    if (size < *(ulong *)((long)ptr + 8)) {
      while (local_240 = uVar3, local_240 < *(ulong *)((long)ptr + 8)) {
        uVar3 = local_240 + 1;
      }
      *(ulong *)((long)ptr + 8) = size;
    }
    pvVar6 = ptr;
    local_230 = size;
    local_228 = ptr;
    if (local_1d8 == *(ulong *)((long)ptr + 0x10)) {
      for (local_248 = *(ulong *)((long)ptr + 8); local_248 < size; local_248 = local_248 + 1) {
        local_98 = *(long *)((long)ptr + 0x18) + local_248 * 0x40;
        local_80 = local_98 + 0x10;
        local_88 = local_98 + 0x20;
        local_70 = local_98 + 0x30;
        local_90 = local_98;
        local_78 = local_98;
      }
      *(ulong *)((long)ptr + 8) = size;
    }
    else {
      local_250 = *(long *)((long)ptr + 0x18);
      local_38 = local_1d8;
      local_30 = ptr;
      pvVar5 = alignedMalloc(size,(size_t)ptr);
      *(void **)((long)ptr + 0x18) = pvVar5;
      for (local_258 = 0; local_258 < *(ulong *)((long)ptr + 8); local_258 = local_258 + 1) {
        local_218 = (undefined8 *)(*(long *)((long)ptr + 0x18) + local_258 * 0x40);
        local_220 = (undefined8 *)(local_250 + local_258 * 0x40);
        local_180 = local_218 + 2;
        local_188 = local_218 + 4;
        local_170 = local_218 + 6;
        uVar2 = local_220[1];
        *local_218 = *local_220;
        local_218[1] = uVar2;
        local_138 = local_220 + 2;
        local_130 = local_218 + 2;
        uVar2 = local_220[3];
        *local_130 = *local_138;
        local_218[3] = uVar2;
        local_148 = local_220 + 4;
        local_140 = local_218 + 4;
        uVar2 = local_220[5];
        *local_140 = *local_148;
        local_218[5] = uVar2;
        local_210 = local_220 + 6;
        local_208 = local_218 + 6;
        uVar2 = local_220[7];
        *local_208 = *local_210;
        local_218[7] = uVar2;
        local_1d0 = local_218;
        local_178 = local_218;
        local_158 = local_220;
        local_150 = local_218;
        local_128 = local_220;
        local_120 = local_218;
      }
      for (local_260 = *(ulong *)((long)ptr + 8); local_260 < local_230; local_260 = local_260 + 1)
      {
        local_68 = *(long *)((long)ptr + 0x18) + local_260 * 0x40;
        local_50 = local_68 + 0x10;
        local_58 = local_68 + 0x20;
        local_40 = local_68 + 0x30;
        local_60 = local_68;
        local_48 = local_68;
      }
      local_28 = *(undefined8 *)((long)ptr + 0x10);
      local_20 = local_250;
      local_18 = ptr;
      alignedFree(ptr);
      *(ulong *)((long)ptr + 8) = local_230;
      *(ulong *)((long)ptr + 0x10) = local_238;
    }
    lVar1 = *(long *)((long)pvVar6 + 8);
    *(long *)((long)pvVar6 + 8) = lVar1 + 1;
    local_298 = (undefined8 *)(*(long *)((long)pvVar6 + 0x18) + lVar1 * 0x40);
    local_2a0 = &local_308;
    local_1b0 = local_298 + 2;
    local_1b8 = local_298 + 4;
    local_160 = local_298 + 6;
    *local_298 = local_308;
    local_298[1] = uStack_300;
    local_b8 = &local_2f8;
    local_b0 = local_298 + 2;
    *local_b0 = local_2f8;
    local_298[3] = uStack_2f0;
    local_c8 = &local_2e8;
    local_c0 = local_298 + 4;
    *local_c0 = local_2e8;
    local_298[5] = uStack_2e0;
    local_290 = &local_2d8;
    local_288 = local_298 + 6;
    *local_288 = local_2d8;
    local_298[7] = uStack_2d0;
    local_1c0 = local_298;
    local_1a8 = local_298;
    local_d8 = local_2a0;
    local_d0 = local_298;
    local_a8 = local_2a0;
    local_a0 = local_298;
  }
  return;
}

Assistant:

void add (const Transformations& other) {
        for (size_t i=0; i<other.size(); i++) spaces.push_back(other[i]);
      }